

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

Float __thiscall
pbrt::HairBxDF::PDF(HairBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
                   BxDFReflTransFlags sampleFlags)

{
  Float FVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Float sinTheta_o;
  undefined1 auVar5 [16];
  int p;
  int p_00;
  long lVar6;
  undefined1 auVar7 [16];
  float sinTheta_o_00;
  float fVar8;
  float fVar9;
  float gamma_t;
  Float FVar10;
  undefined1 auVar11 [64];
  undefined1 auVar14 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined8 in_XMM2_Qb;
  undefined1 auVar17 [16];
  array<float,_4> aVar18;
  array<float,_4> apPDF;
  uint local_a8;
  float local_98;
  ulong uStack_90;
  float local_78;
  Float local_68;
  undefined1 local_20 [16];
  undefined1 extraout_var [60];
  undefined1 auVar16 [56];
  
  auVar11._8_56_ = wo._8_56_;
  auVar11._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_68 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  sinTheta_o_00 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar17._0_12_ = ZEXT812(0);
  auVar17._12_4_ = 0;
  auVar7 = vmaxss_avx(ZEXT416((uint)(1.0 - sinTheta_o_00 * sinTheta_o_00)),auVar17);
  auVar3 = vsqrtss_avx(auVar7,auVar7);
  auVar7 = vmovshdup_avx(auVar11._0_16_);
  fVar8 = atan2f(wo.super_Tuple3<pbrt::Vector3,_float>.z,auVar7._0_4_);
  auVar7._8_8_ = in_XMM2_Qb;
  auVar7._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(ZEXT416((uint)(1.0 - local_68 * local_68)),ZEXT416(0));
  auVar4 = vsqrtss_avx(auVar7,auVar7);
  fVar9 = atan2f(wi.super_Tuple3<pbrt::Vector3,_float>.z,auVar17._0_4_);
  auVar7 = vfmsub213ss_fma(ZEXT416((uint)this->eta),ZEXT416((uint)this->eta),
                           ZEXT416((uint)(sinTheta_o_00 * sinTheta_o_00)));
  local_a8 = 0;
  auVar7 = vmaxss_avx(auVar7,ZEXT416(0));
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  local_98 = auVar3._0_4_;
  auVar16 = ZEXT856(auVar7._8_8_);
  gamma_t = SafeASin(this->h / (auVar7._0_4_ / local_98));
  uStack_90 = auVar3._8_8_;
  auVar14 = ZEXT856(uStack_90);
  aVar18 = ComputeApPDF(this,local_98);
  auVar15._0_8_ = aVar18.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar12._0_8_ = aVar18.values._0_8_;
  auVar12._8_56_ = auVar14;
  local_20 = vmovlhps_avx(auVar12._0_16_,auVar15._0_16_);
  lVar6 = 0;
  do {
    if (lVar6 == 3) {
      auVar7 = vmovshdup_avx(auVar15._0_16_);
      FVar10 = Mp(auVar4._0_4_,local_98,local_68,sinTheta_o_00,this->v[3]);
      local_78 = auVar7._0_4_;
      auVar7 = vfmadd231ss_fma(ZEXT416(local_a8),ZEXT416((uint)(FVar10 * local_78)),
                               ZEXT416(0x3e22f983));
      return auVar7._0_4_;
    }
    p_00 = (int)lVar6;
    if (p_00 == 2) {
      FVar10 = this->sin2kAlpha[2];
      FVar1 = this->cos2kAlpha[2];
LAB_003ad7d0:
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_98 * FVar10)),ZEXT416((uint)FVar1),
                               ZEXT416((uint)sinTheta_o_00));
      sinTheta_o = auVar7._0_4_;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(FVar10 * -sinTheta_o_00)),auVar3,ZEXT416((uint)FVar1))
      ;
    }
    else {
      if (p_00 == 1) {
        FVar10 = this->sin2kAlpha[0];
        FVar1 = this->cos2kAlpha[0];
        goto LAB_003ad7d0;
      }
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(sinTheta_o_00 * this->sin2kAlpha[1])),
                               ZEXT416((uint)this->cos2kAlpha[1]),ZEXT416((uint)local_98));
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * -local_98)),auVar11._0_16_,
                                ZEXT416((uint)this->cos2kAlpha[1]));
      sinTheta_o = auVar17._0_4_;
    }
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(auVar7,auVar5);
    FVar10 = Mp(auVar4._0_4_,auVar7._0_4_,local_68,sinTheta_o,this->v[lVar6]);
    fVar2 = *(float *)(local_20 + lVar6 * 4);
    auVar13._0_4_ = Np(fVar9 - fVar8,p_00,this->s,this->gamma_o,gamma_t);
    auVar13._4_60_ = extraout_var;
    lVar6 = lVar6 + 1;
    auVar7 = vfmadd231ss_fma(ZEXT416(local_a8),auVar13._0_16_,ZEXT416((uint)(FVar10 * fVar2)));
    local_a8 = auVar7._0_4_;
  } while( true );
}

Assistant:

Float HairBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                    BxDFReflTransFlags sampleFlags) const {
    // TODO? flags...

    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);

    // Compute hair coordinate system terms related to _wi_
    Float sinTheta_i = wi.x;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));
    Float phi_i = std::atan2(wi.z, wi.y);

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute PDF for $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF = ComputeApPDF(cosTheta_o);

    // Compute PDF sum for hair scattering events
    Float phi = phi_i - phi_o;
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Compute $\sin \thetao$ and $\cos \thetao$ terms accounting for scales
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        }

        // Handle remainder of $p$ values for hair scale tilt
        else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos \thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);
        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(phi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    return pdf;
}